

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O2

int BackwardRefsClone(VP8LBackwardRefs *from,VP8LBackwardRefs *to)

{
  PixOrCopyBlock *pPVar1;
  PixOrCopyBlock *pPVar2;
  
  pPVar2 = from->refs;
  VP8LClearBackwardRefs(to);
  while( true ) {
    if (pPVar2 == (PixOrCopyBlock *)0x0) {
      return 1;
    }
    pPVar1 = BackwardRefsNewBlock(to);
    if (pPVar1 == (PixOrCopyBlock *)0x0) break;
    memcpy(pPVar1->start,pPVar2->start,(long)pPVar2->size << 3);
    pPVar1->size = pPVar2->size;
    pPVar2 = pPVar2->next;
  }
  return 0;
}

Assistant:

static int BackwardRefsClone(const VP8LBackwardRefs* const from,
                             VP8LBackwardRefs* const to) {
  const PixOrCopyBlock* block_from = from->refs;
  VP8LClearBackwardRefs(to);
  while (block_from != NULL) {
    PixOrCopyBlock* const block_to = BackwardRefsNewBlock(to);
    if (block_to == NULL) return 0;
    memcpy(block_to->start, block_from->start,
           block_from->size * sizeof(PixOrCopy));
    block_to->size = block_from->size;
    block_from = block_from->next;
  }
  return 1;
}